

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:267:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:267:17)>
            *this)

{
  long *plVar1;
  CapTableBuilder *pCVar2;
  ClientHook *pCVar3;
  void *pvVar4;
  undefined8 *puVar5;
  Own<capnp::MembranePolicy> *in_R9;
  Own<capnp::ClientHook> OVar6;
  Orphanage OVar7;
  Orphanage to;
  Builder ptr;
  MallocMessageBuilder insideBuilder;
  MallocMessageBuilder outsideBuilder;
  CapTableReader local_2c8;
  long *local_2c0;
  OrphanBuilder local_2b8;
  StructBuilder local_298;
  PointerBuilder local_270;
  pointer_____offset_0x10___ *local_250;
  Client local_248;
  PointerBuilder local_238;
  PointerBuilder local_220;
  MallocMessageBuilder local_208;
  MallocMessageBuilder local_118;
  
  capnp::MallocMessageBuilder::MallocMessageBuilder(&local_118,0x400,GROW_HEURISTICALLY);
  capnp::MessageBuilder::getRootInternal((Builder *)&local_2b8,&local_118.super_MessageBuilder);
  local_298.data = local_2b8.capTable;
  local_298.segment = (SegmentBuilder *)local_2b8.tag.content;
  local_298.capTable = (CapTableBuilder *)local_2b8.segment;
  capnp::_::PointerBuilder::initStruct
            ((StructBuilder *)&local_208,(PointerBuilder *)&local_298,(StructSize)0x10000);
  local_238.segment = (SegmentBuilder *)local_208.super_MessageBuilder._vptr_MessageBuilder;
  local_238.capTable = (CapTableBuilder *)local_208.super_MessageBuilder.arenaSpace[0];
  local_238.pointer = (WirePointer *)local_208.super_MessageBuilder.arenaSpace[2];
  puVar5 = (undefined8 *)operator_new(0x28);
  local_208.super_MessageBuilder.arenaSpace[0] = puVar5 + 3;
  puVar5[4] = 0;
  *puVar5 = 0x62e298;
  puVar5[3] = 0x62e2c8;
  puVar5[1] = "inside";
  puVar5[2] = 7;
  local_208.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::ThingImpl>::instance;
  OVar6 = capnp::Capability::Client::makeLocalClient
                    (&local_248,(Own<capnp::Capability::Server> *)&local_208);
  pvVar4 = local_208.super_MessageBuilder.arenaSpace[0];
  if ((long *)local_208.super_MessageBuilder.arenaSpace[0] != (long *)0x0) {
    local_208.super_MessageBuilder.arenaSpace[0] = (void *)0x0;
    (**(code **)*local_208.super_MessageBuilder._vptr_MessageBuilder)
              (local_208.super_MessageBuilder._vptr_MessageBuilder,
               (long)pvVar4 + *(long *)(*pvVar4 + -0x10),OVar6.ptr);
  }
  local_250 = &capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  local_208.super_MessageBuilder.arenaSpace[1] = local_238.pointer;
  local_208.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_238.segment;
  local_208.super_MessageBuilder.arenaSpace[0] = local_238.capTable;
  (*(local_248.hook.ptr)->_vptr_ClientHook[4])(&local_298);
  capnp::_::PointerBuilder::setCapability
            ((PointerBuilder *)&local_208,(Own<capnp::ClientHook> *)&local_298);
  pCVar2 = local_298.capTable;
  if ((SegmentBuilder *)local_298.capTable != (SegmentBuilder *)0x0) {
    local_298.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_298.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_298.segment,
               (long)&((SegmentReader *)&pCVar2->super_CapTableReader)->arena +
               (long)((SegmentReader *)&pCVar2->super_CapTableReader)->arena[-2]._vptr_Arena);
  }
  pCVar3 = local_248.hook.ptr;
  if (local_248.hook.ptr != (ClientHook *)0x0) {
    local_248.hook.ptr = (ClientHook *)0x0;
    (**(local_248.hook.disposer)->_vptr_Disposer)
              (local_248.hook.disposer,
               pCVar3->_vptr_ClientHook[-2] + (long)&pCVar3->_vptr_ClientHook);
  }
  capnp::MallocMessageBuilder::MallocMessageBuilder(&local_208,0x400,GROW_HEURISTICALLY);
  capnp::MessageBuilder::getRootInternal((Builder *)&local_270,&local_208.super_MessageBuilder);
  local_2b8.capTable = (CapTableBuilder *)local_270.pointer;
  local_2b8.tag.content = (uint64_t)local_270.segment;
  local_2b8.segment = (SegmentBuilder *)local_270.capTable;
  capnp::_::PointerBuilder::initStruct(&local_298,(PointerBuilder *)&local_2b8,(StructSize)0x10000);
  local_220.segment = local_298.segment;
  local_220.capTable = local_298.capTable;
  local_220.pointer = local_298.pointers;
  capnp::_::PointerBuilder::asReader(&local_238);
  OVar7 = capnp::MessageBuilder::getOrphanage(&local_208.super_MessageBuilder);
  (*(((((this->f).env)->policy).ptr)->super_MembranePolicy)._vptr_MembranePolicy[2])(&local_2c8);
  to.capTable = (CapTableBuilder *)&local_2c8;
  to.arena = (BuilderArena *)OVar7.capTable;
  capnp::copyOutOfMembrane<capnp::AnyPointer::Reader>
            ((Orphan<capnp::AnyPointer> *)&local_2b8,(capnp *)&local_270,(Reader *)OVar7.arena,to,
             in_R9);
  capnp::_::PointerBuilder::adopt(&local_220,&local_2b8);
  if (local_2b8.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&local_2b8);
  }
  plVar1 = local_2c0;
  if (local_2c0 != (long *)0x0) {
    local_2c0 = (long *)0x0;
    (**(code **)*local_2c8._vptr_CapTableReader)
              (local_2c8._vptr_CapTableReader,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  capnp::MessageBuilder::getRootInternal((Builder *)&local_270,&local_208.super_MessageBuilder);
  local_2b8.capTable = (CapTableBuilder *)local_270.pointer;
  local_2b8.tag.content = (uint64_t)local_270.segment;
  local_2b8.segment = (SegmentBuilder *)local_270.capTable;
  capnp::_::PointerBuilder::getStruct
            (&local_298,(PointerBuilder *)&local_2b8,(StructSize)0x10000,(word *)0x0);
  local_2b8.tag.content = (uint64_t)local_298.segment;
  local_2b8.segment = (SegmentBuilder *)local_298.capTable;
  local_2b8.capTable = (CapTableBuilder *)local_298.pointers;
  capnp::_::PointerBuilder::getCapability(&local_270);
  *(SegmentBuilder **)&__return_storage_ptr__->field_0x8 = local_270.segment;
  *(CapTableBuilder **)&__return_storage_ptr__->field_0x10 = local_270.capTable;
  local_270.capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->_vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  capnp::MallocMessageBuilder::~MallocMessageBuilder(&local_208);
  capnp::MallocMessageBuilder::~MallocMessageBuilder(&local_118);
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }